

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_string_iterator_next
                  (JSContext *ctx,JSValue this_val,int argc,JSValue *argv,BOOL *pdone,int magic)

{
  JSValueUnion p;
  undefined1 auVar1 [16];
  uint uVar2;
  JSValueUnion *pJVar3;
  ulong uVar4;
  JSValue JVar5;
  JSValue JVar6;
  ulong uStack_40;
  uint32_t idx;
  
  pJVar3 = (JSValueUnion *)JS_GetOpaque2(ctx,this_val,0x26);
  if (pJVar3 == (JSValueUnion *)0x0) {
    *pdone = 0;
    uStack_40 = 6;
  }
  else {
    if (pJVar3[1].int32 != 3) {
      p = (JSValueUnion)pJVar3->ptr;
      idx = *(uint *)((long)pJVar3 + 0x14);
      uVar4 = (ulong)idx;
      if (idx < (*(uint *)((long)p.ptr + 4) & 0x7fffffff)) {
        uVar2 = string_getc((JSString *)p.ptr,(int *)&idx);
        *(uint32_t *)((long)pJVar3 + 0x14) = idx;
        *pdone = 0;
        if (uVar2 < 0x10000) {
          JVar5 = js_new_string_char(ctx,(uint16_t)uVar2);
        }
        else {
          JVar5 = js_new_string16(ctx,(uint16_t *)((long)p.ptr + uVar4 * 2 + 0x10),2);
        }
        uVar4 = (ulong)JVar5.u.ptr & 0xffffffff00000000;
        goto LAB_00159541;
      }
      JVar5.tag = (int64_t)pJVar3[1].ptr;
      JVar5.u = (JSValueUnion)(JSValueUnion)p.ptr;
      JS_FreeValue(ctx,JVar5);
      pJVar3->int32 = 0;
      pJVar3[1].float64 = 1.48219693752374e-323;
    }
    *pdone = 1;
    uStack_40 = 3;
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uStack_40;
  JVar5 = (JSValue)(auVar1 << 0x40);
  uVar4 = 0;
LAB_00159541:
  JVar6.tag = JVar5.tag;
  JVar6.u.ptr = (void *)((ulong)JVar5.u.ptr & 0xffffffff | uVar4);
  return JVar6;
}

Assistant:

static JSValue js_string_iterator_next(JSContext *ctx, JSValueConst this_val,
                                       int argc, JSValueConst *argv,
                                       BOOL *pdone, int magic)
{
    JSArrayIteratorData *it;
    uint32_t idx, c, start;
    JSString *p;

    it = JS_GetOpaque2(ctx, this_val, JS_CLASS_STRING_ITERATOR);
    if (!it) {
        *pdone = FALSE;
        return JS_EXCEPTION;
    }
    if (JS_IsUndefined(it->obj))
        goto done;
    p = JS_VALUE_GET_STRING(it->obj);
    idx = it->idx;
    if (idx >= p->len) {
        JS_FreeValue(ctx, it->obj);
        it->obj = JS_UNDEFINED;
    done:
        *pdone = TRUE;
        return JS_UNDEFINED;
    }

    start = idx;
    c = string_getc(p, (int *)&idx);
    it->idx = idx;
    *pdone = FALSE;
    if (c <= 0xffff) {
        return js_new_string_char(ctx, c);
    } else {
        return js_new_string16(ctx, p->u.str16 + start, 2);
    }
}